

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O0

void glsl_destroy_shader(ALLEGRO_SHADER *shader)

{
  _AL_VECTOR *in_RDI;
  void *unaff_retaddr;
  ALLEGRO_SHADER_GLSL_S *gl_shader;
  char *in_stack_ffffffffffffffe8;
  _AL_VECTOR *vec;
  int line;
  
  vec = in_RDI;
  al_lock_mutex((ALLEGRO_MUTEX *)0x235d4f);
  _al_vector_find_and_delete(vec,in_RDI);
  line = (int)((ulong)vec >> 0x20);
  al_unlock_mutex((ALLEGRO_MUTEX *)0x235d6c);
  (*_al_glDeleteShader)((GLuint)in_RDI[2]._size);
  (*_al_glDeleteShader)(*(GLuint *)((long)&in_RDI[2]._size + 4));
  (*_al_glDeleteProgram)((GLuint)in_RDI[2]._unused);
  al_free_with_context(unaff_retaddr,line,(char *)in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void glsl_destroy_shader(ALLEGRO_SHADER *shader)
{
   ALLEGRO_SHADER_GLSL_S *gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;

   al_lock_mutex(shaders_mutex);
   _al_vector_find_and_delete(&shaders, &shader);
   al_unlock_mutex(shaders_mutex);

   glDeleteShader(gl_shader->vertex_shader);
   glDeleteShader(gl_shader->pixel_shader);
   glDeleteProgram(gl_shader->program_object);
   al_free(shader);
}